

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExtGNU_AttributeSpecifier_AtFirst(Parser *this,SpecifierSyntax **spec)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ostream *poVar3;
  ExtGNU_AttributeSpecifierSyntax *pEVar4;
  IndexType IVar5;
  ExtGNU_AttributeSpecifierSyntax *attrSpec;
  SpecifierSyntax **spec_local;
  Parser *this_local;
  
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == KeywordAlias___attribute) {
    pEVar4 = makeNode<psy::C::ExtGNU_AttributeSpecifierSyntax>(this);
    *spec = &pEVar4->super_SpecifierSyntax;
    IVar5 = consume(this);
    pEVar4->attrKwTkIdx_ = IVar5;
    bVar1 = match(this,OpenParenToken,&pEVar4->openOuterParenTkIdx_);
    if ((((bVar1) && (bVar1 = match(this,OpenParenToken,&pEVar4->openInnerParenTkIdx_), bVar1)) &&
        (bVar1 = parseExtGNU_AttributeList(this,&pEVar4->attrs_), bVar1)) &&
       ((bVar1 = match(this,CloseParenToken,&pEVar4->closeInnerParenTkIdx_), bVar1 &&
        (bVar1 = match(this,CloseParenToken,&pEVar4->closeOuterParenTkIdx_), bVar1)))) {
      this_local._7_1_ = true;
    }
    else {
      skipTo(this,CloseParenToken);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x66c);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `__attribute__\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseExtGNU_AttributeSpecifier_AtFirst(SpecifierSyntax*& spec)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__,
                  return false,
                  "assert failure: `__attribute__'");

    auto attrSpec = makeNode<ExtGNU_AttributeSpecifierSyntax>();
    spec = attrSpec;
    attrSpec->attrKwTkIdx_ = consume();

    if (match(SyntaxKind::OpenParenToken, &attrSpec->openOuterParenTkIdx_)
            && match(SyntaxKind::OpenParenToken, &attrSpec->openInnerParenTkIdx_)
            && parseExtGNU_AttributeList(attrSpec->attrs_)
            && match(SyntaxKind::CloseParenToken, &attrSpec->closeInnerParenTkIdx_)
            && match(SyntaxKind::CloseParenToken, &attrSpec->closeOuterParenTkIdx_))
        return true;

    skipTo(SyntaxKind::CloseParenToken);
    return false;
}